

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O1

int run_test_barrier_serial_thread(void)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_thread_t threads [4];
  uv_barrier_t barrier;
  long local_68 [5];
  undefined1 local_40 [32];
  
  iVar1 = uv_barrier_init(local_40,5);
  local_68[0] = (long)iVar1;
  if (local_68[0] == 0) {
    lVar3 = 0;
    do {
      iVar1 = uv_thread_create((long)local_68 + lVar3,serial_worker,local_40);
      if (iVar1 != 0) {
        run_test_barrier_serial_thread_cold_2();
        goto LAB_001828b1;
      }
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    iVar1 = 5;
    do {
      uv_barrier_wait(local_40);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = uv_barrier_wait(local_40);
    if (0 < iVar1) {
      uv_barrier_destroy(local_40);
    }
    lVar3 = 0;
    while( true ) {
      iVar1 = uv_thread_join((long)local_68 + lVar3);
      if (iVar1 != 0) break;
      lVar3 = lVar3 + 8;
      if (lVar3 == 0x20) {
        return 0;
      }
    }
LAB_001828b1:
    run_test_barrier_serial_thread_cold_3();
  }
  plVar2 = local_68;
  run_test_barrier_serial_thread_cold_1();
  iVar1 = 5;
  do {
    uv_barrier_wait(plVar2);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = uv_barrier_wait(plVar2);
  if (0 < iVar1) {
    uv_barrier_destroy(plVar2);
  }
  iVar1 = uv_sleep(100);
  return iVar1;
}

Assistant:

TEST_IMPL(barrier_serial_thread) {
  uv_thread_t threads[4];
  uv_barrier_t barrier;
  unsigned i;

  ASSERT_OK(uv_barrier_init(&barrier, ARRAY_SIZE(threads) + 1));

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_create(&threads[i], serial_worker, &barrier));

  for (i = 0; i < 5; i++)
    uv_barrier_wait(&barrier);
  if (uv_barrier_wait(&barrier) > 0)
    uv_barrier_destroy(&barrier);

  for (i = 0; i < ARRAY_SIZE(threads); ++i)
    ASSERT_OK(uv_thread_join(&threads[i]));

  return 0;
}